

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::EmptyArrayName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FieldDescriptor *field)

{
  FieldDescriptor *this_00;
  JavaType JVar1;
  Params *params_00;
  LogMessage *other;
  uint *descriptor;
  allocator local_9a;
  LogFinisher local_99;
  LogMessage local_98;
  string local_60;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  Params *local_20;
  FieldDescriptor *field_local;
  Params *params_local;
  
  local_20 = params;
  field_local = (FieldDescriptor *)this;
  params_local = (Params *)__return_storage_ptr__;
  JVar1 = GetJavaType((FieldDescriptor *)params);
  this_00 = field_local;
  descriptor = &switchD_0038fb18::switchdataD_005d4050;
  switch(JVar1) {
  case JAVATYPE_INT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case JAVATYPE_LONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_LONG_ARRAY",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
    break;
  case JAVATYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_FLOAT_ARRAY",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case JAVATYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_DOUBLE_ARRAY",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case JAVATYPE_BOOLEAN:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_BOOLEAN_ARRAY",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case JAVATYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_STRING_ARRAY",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case JAVATYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES_ARRAY",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  case JAVATYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    break;
  case JAVATYPE_MESSAGE:
    params_00 = (Params *)FieldDescriptor::message_type((FieldDescriptor *)local_20);
    ClassName_abi_cxx11_(&local_60,(javanano *)this_00,params_00,(Descriptor *)descriptor);
    std::operator+(__return_storage_ptr__,&local_60,".EMPTY_ARRAY");
    std::__cxx11::string::~string((string *)&local_60);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,399);
    other = internal::LogMessage::operator<<(&local_98,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_99,other);
    internal::LogMessage::~LogMessage(&local_98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9a);
    std::allocator<char>::~allocator((allocator<char> *)&local_9a);
  }
  return __return_storage_ptr__;
}

Assistant:

string EmptyArrayName(const Params& params, const FieldDescriptor* field) {
  switch (GetJavaType(field)) {
    case JAVATYPE_INT    : return "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY";
    case JAVATYPE_LONG   : return "com.google.protobuf.nano.WireFormatNano.EMPTY_LONG_ARRAY";
    case JAVATYPE_FLOAT  : return "com.google.protobuf.nano.WireFormatNano.EMPTY_FLOAT_ARRAY";
    case JAVATYPE_DOUBLE : return "com.google.protobuf.nano.WireFormatNano.EMPTY_DOUBLE_ARRAY";
    case JAVATYPE_BOOLEAN: return "com.google.protobuf.nano.WireFormatNano.EMPTY_BOOLEAN_ARRAY";
    case JAVATYPE_STRING : return "com.google.protobuf.nano.WireFormatNano.EMPTY_STRING_ARRAY";
    case JAVATYPE_BYTES  : return "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES_ARRAY";
    case JAVATYPE_ENUM   : return "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY";
    case JAVATYPE_MESSAGE: return ClassName(params, field->message_type()) + ".EMPTY_ARRAY";

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}